

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O3

void rec_mm_equal(jit_State *J,RecordIndex *ix,int op)

{
  TRef TVar1;
  ulong uVar2;
  IRRef1 IVar3;
  int iVar4;
  TRef TVar5;
  TValue mo1v;
  TValue local_28;
  
  ix->tab = ix->val;
  ix->tabv = ix->valv;
  iVar4 = lj_record_mm_lookup(J,ix,MM_eq);
  if (iVar4 == 0) {
    return;
  }
  TVar1 = ix->mobj;
  local_28 = ix->mobjv;
  uVar2 = (ix->keyv).u64;
  if ((uVar2 & 0xffff800000000000) == 0xfff9800000000000) {
    if (ix->mtv != *(GCtab **)((uVar2 & 0x7fffffffffff) + 0x20)) goto LAB_00150c95;
    IVar3 = 0xb;
  }
  else {
    if (((uVar2 & 0xffff800000000000) != 0xfffa000000000000) ||
       (ix->mtv != *(GCtab **)((uVar2 & 0x7fffffffffff) + 0x20))) {
LAB_00150c95:
      ix->tab = ix->key;
      (ix->tabv).u64 = uVar2;
      iVar4 = lj_record_mm_lookup(J,ix,MM_eq);
      if (iVar4 == 0) {
        return;
      }
      iVar4 = lj_record_objcmp(J,TVar1,ix->mobj,&local_28,&ix->mobjv);
      if (iVar4 != 0) {
        return;
      }
      goto LAB_00150d21;
    }
    IVar3 = 5;
  }
  TVar1 = ix->key;
  (J->fold).ins.field_0.ot = 0x450b;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
  (J->fold).ins.field_0.op2 = IVar3;
  TVar5 = lj_opt_fold(J);
  TVar1 = ix->mt;
  (J->fold).ins.field_0.ot = 0x88b;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
  lj_opt_fold(J);
LAB_00150d21:
  rec_mm_callcomp(J,ix,op);
  return;
}

Assistant:

static void rec_mm_equal(jit_State *J, RecordIndex *ix, int op)
{
  ix->tab = ix->val;
  copyTV(J->L, &ix->tabv, &ix->valv);
  if (lj_record_mm_lookup(J, ix, MM_eq)) {  /* Lookup mm on 1st operand. */
    cTValue *bv;
    TRef mo1 = ix->mobj;
    TValue mo1v;
    copyTV(J->L, &mo1v, &ix->mobjv);
    /* Avoid the 2nd lookup and the objcmp if the metatables are equal. */
    bv = &ix->keyv;
    if (tvistab(bv) && tabref(tabV(bv)->metatable) == ix->mtv) {
      TRef mt2 = emitir(IRT(IR_FLOAD, IRT_TAB), ix->key, IRFL_TAB_META);
      emitir(IRTG(IR_EQ, IRT_TAB), mt2, ix->mt);
    } else if (tvisudata(bv) && tabref(udataV(bv)->metatable) == ix->mtv) {
      TRef mt2 = emitir(IRT(IR_FLOAD, IRT_TAB), ix->key, IRFL_UDATA_META);
      emitir(IRTG(IR_EQ, IRT_TAB), mt2, ix->mt);
    } else {  /* Lookup metamethod on 2nd operand and compare both. */
      ix->tab = ix->key;
      copyTV(J->L, &ix->tabv, bv);
      if (!lj_record_mm_lookup(J, ix, MM_eq) ||
	  lj_record_objcmp(J, mo1, ix->mobj, &mo1v, &ix->mobjv))
	return;
    }
    rec_mm_callcomp(J, ix, op);
  }
}